

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O3

uint32 __thiscall
Js::ByteCodeBufferBuilder::PrependVarConstant
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,Var var)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  uint32 uVar5;
  uint32 uVar6;
  undefined4 *puVar7;
  RecyclableObject *this_00;
  JavascriptBoolean *pJVar8;
  byte value;
  char *message;
  char16_t *clue;
  char *error;
  uint lineNumber;
  int value_00;
  
  if ((undefined8 *)var == &NullFrameDisplay) {
    clue = L"Null Frame Display";
    value = '\t';
    goto LAB_00882a09;
  }
  if ((undefined8 *)var == &StrictNullFrameDisplay) {
    clue = L"Strict Null Frame Display";
    value = '\n';
    goto LAB_00882a09;
  }
  if (var != (Var)0x0) {
    if (((ulong)var & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)var & 0xffff000000000000) != 0x1000000000000) {
      bVar3 = true;
      if (((ulong)var & 0xffff000000000000) != 0x1000000000000) {
        if ((ulong)var >> 0x32 == 0) goto LAB_00882a72;
        goto switchD_00882b63_caseD_4;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar3) goto LAB_00882ebd;
      *puVar7 = 0;
      bVar3 = true;
    }
LAB_00882d07:
    if ((bool)(bVar3 ^ 1U | ((ulong)var & 0x1ffff00000000) == 0x1000000000000)) {
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        error = "(Is(aValue))";
        message = "Ensure var is actually a \'TaggedInt\'";
        lineNumber = 0x43;
        goto LAB_00882d9e;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      error = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
      message = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
      lineNumber = 0x2a;
LAB_00882d9e:
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,lineNumber,error,message);
      if (!bVar3) goto LAB_00882ebd;
      *puVar7 = 0;
    }
    value_00 = (int)var;
    if ((char)(byte)var == value_00) {
      uVar5 = PrependByte(this,builder,L"Integer Constant",'\x01');
      uVar6 = PrependByte(this,builder,L"Integer Constant Value",(byte)var);
    }
    else if ((short)var == value_00) {
      uVar5 = PrependByte(this,builder,L"Integer Constant",'\x02');
      uVar6 = PrependConstantInt16
                        (this,builder,L"Integer Constant Value",(short)var,
                         (ConstantSizedBufferBuilderOf<short> **)0x0);
    }
    else {
      uVar5 = PrependByte(this,builder,L"Integer Constant",'\x03');
      uVar6 = PrependConstantInt32
                        (this,builder,L"Integer Constant Value",value_00,
                         (ConstantSizedBufferBuilderOf<int> **)0x0);
    }
LAB_00882e51:
    return uVar6 + uVar5;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar7 = 1;
  bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                              ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
  if (!bVar3) goto LAB_00882ebd;
  *puVar7 = 0;
LAB_00882a72:
  this_00 = UnsafeVarTo<Js::RecyclableObject>(var);
  if (this_00 == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00882ebd;
    *puVar7 = 0;
  }
  TVar1 = ((this_00->type).ptr)->typeId;
  if ((0x57 < (int)TVar1) && (BVar4 = RecyclableObject::IsExternal(this_00), BVar4 == 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                "GetTypeId aValue has invalid TypeId");
    if (!bVar3) goto LAB_00882ebd;
    *puVar7 = 0;
  }
  switch(TVar1) {
  case TypeIds_Undefined:
    clue = L"Undefined Constant";
    value = '\b';
    break;
  case TypeIds_Null:
    clue = L"Null Constant";
    value = '\a';
    break;
  case TypeIds_Boolean:
    pJVar8 = VarTo<Js::JavascriptBoolean>(var);
    value = (pJVar8->value == 0) + '\v';
    clue = L"Boolean Constant";
    break;
  case TypeIds_FirstNumberType:
    bVar3 = ((ulong)var & 0xffff000000000000) == 0x1000000000000;
    goto LAB_00882d07;
  case TypeIds_Number:
switchD_00882b63_caseD_4:
    uVar5 = PrependByte(this,builder,L"Number Constant",'\x04');
    if ((ulong)var >> 0x32 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.h"
                                  ,0xd4,"(Is(aValue))",
                                  "Ensure var is actually a \'JavascriptNumber\'");
      if (!bVar3) goto LAB_00882ebd;
      *puVar7 = 0;
    }
    uVar6 = PrependDouble(this,builder,L"Number Constant Value",
                          (double)((ulong)var ^ 0xfffc000000000000));
    goto LAB_00882e51;
  case TypeIds_String:
    bVar3 = VarIs<Js::PropertyString>(var);
    uVar5 = PrependByte(this,builder,L"String Constant 16",bVar3 + '\x05');
    uVar6 = PrependStringConstant(this,builder,var);
    goto LAB_00882e51;
  default:
    if (TVar1 == TypeIds_ArrayLastWithES5) {
      uVar5 = PrependByte(this,builder,L"String Template Callsite Constant",'\r');
      uVar6 = PrependStringTemplateCallsiteConstant(this,builder,var);
      goto LAB_00882e51;
    }
  case TypeIds_Int64Number:
  case TypeIds_LastNumberType:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x62e,"((0))","Unexpected object type in AddConstantTable");
    if (bVar3) {
      *puVar7 = 0;
      Throw::FatalInternalError(-0x7fffbffb);
    }
LAB_00882ebd:
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
LAB_00882a09:
  uVar5 = PrependByte(this,builder,clue,value);
  return uVar5;
}

Assistant:

uint32 PrependVarConstant(BufferBuilderList & builder, Var var)
    {
        if (var == (Js::Var)&Js::NullFrameDisplay)
        {
            return PrependByte(builder, _u("Null Frame Display"), ctNullDisplay);
        }
        else if (var == (Js::Var)&Js::StrictNullFrameDisplay)
        {
            return PrependByte(builder, _u("Strict Null Frame Display"), ctStrictNullDisplay);
        }

        auto typeId = JavascriptOperators::GetTypeId(var);
        switch (typeId)
        {
        case TypeIds_Undefined:
            return PrependByte(builder, _u("Undefined Constant"), ctUndefined);

        case TypeIds_Null:
            return PrependByte(builder, _u("Null Constant"), ctNull);

        case TypeIds_Boolean:
            return PrependByte(builder, _u("Boolean Constant"), VarTo<JavascriptBoolean>(var)->GetValue()? ctTrue : ctFalse);

        case TypeIds_Number:
        {
            auto size = PrependByte(builder, _u("Number Constant"), ctNumber);
            return size + PrependDouble(builder,  _u("Number Constant Value"), JavascriptNumber::GetValue(var));
        }

        case TypeIds_Integer:
        {
            int32 value = TaggedInt::ToInt32(var);
            if ((int8)value == value)
            {
                auto size = PrependByte(builder, _u("Integer Constant"), ctInt8);
                return size + PrependByte(builder, _u("Integer Constant Value"), (byte)value);
            }
            else if ((int16)value == value)
            {
                auto size = PrependByte(builder, _u("Integer Constant"), ctInt16);
                return size + PrependConstantInt16(builder, _u("Integer Constant Value"), (int16)value);
            }
            else
            {
                auto size = PrependByte(builder, _u("Integer Constant"), ctInt32);
                return size + PrependConstantInt32(builder, _u("Integer Constant Value"), value);
            }
        }

        case TypeIds_String:
        {
            auto size = PrependByte(builder, _u("String Constant 16"),
                Js::VarIs<Js::PropertyString>(var)? ctPropertyString16 : ctString16);
            return size + PrependStringConstant(builder, var);
        }

        case TypeIds_ES5Array:
        {
            // ES5Array objects in the constant table are always string template callsite objects.
            // If we later put other ES5Array objects in the constant table, we'll need another way
            // to decide the constant type.
            auto size = PrependByte(builder, _u("String Template Callsite Constant"), ctStringTemplateCallsite);
            return size + PrependStringTemplateCallsiteConstant(builder, var);
        }

        default:
            AssertMsg(UNREACHED, "Unexpected object type in AddConstantTable");
            Throw::FatalInternalError();
        }
    }